

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

UniquePtr<struct_stack_st_X509_NAME> DecodeHexX509Names(string *hex_names)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  enable_if_t<_internal::StackTraits<stack_st_X509_NAME>::kIsConst,_bool> eVar4;
  int iVar5;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  _Head_base<0UL,_unsigned_char_*,_false> _Var6;
  ulong uVar7;
  _Head_base<0UL,_stack_st_X509_NAME_*,_false> _Var8;
  long *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pbVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  pointer pbVar13;
  byte local_ba;
  uint8_t high;
  __array buf;
  UniquePtr<struct_stack_st_X509_NAME> ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Head_base<0UL,_stack_st_X509_NAME_*,_false> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  der_names;
  unique_ptr<X509_name_st,_bssl::internal::Deleter> local_40;
  pointer local_38;
  
  der_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  der_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  der_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar12 = 0;
  local_90._M_head_impl = (stack_st_X509_NAME *)hex_names;
  do {
    lVar10 = 0;
    while( true ) {
      if ((ulong)in_RSI[1] <= (ulong)(lVar12 + lVar10)) {
        std::__cxx11::string::substr((ulong)&ret,(ulong)in_RSI);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
        std::__cxx11::string::~string((string *)&ret);
        local_38 = parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bVar3 = false;
        pbVar13 = parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0012aaaa;
      }
      if (*(char *)(*in_RSI + lVar12 + lVar10) == ',') break;
      lVar10 = lVar10 + 1;
    }
    std::__cxx11::string::substr((ulong)&ret,(ulong)in_RSI);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
    std::__cxx11::string::~string((string *)&ret);
    lVar12 = lVar12 + lVar10 + 1;
  } while( true );
LAB_0012aaaa:
  do {
    if (pbVar13 == local_38) {
      this = &parts;
      goto LAB_0012abe1;
    }
    ret._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)&local_a0;
    local_a0._M_local_buf[0] = '\0';
    uVar7 = pbVar13->_M_string_length;
    if ((uVar7 & 1) == 0) {
      __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
           operator_new__(uVar7 >> 1);
      memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar7 >> 1);
      buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      for (uVar11 = 0; uVar11 < uVar7 >> 1; uVar11 = uVar11 + 1) {
        iVar5 = OPENSSL_fromxdigit(&high,(int)(pbVar13->_M_dataplus)._M_p[uVar11 * 2]);
        if (iVar5 == 0) goto LAB_0012ab60;
        iVar5 = OPENSSL_fromxdigit(&local_ba,(int)(pbVar13->_M_dataplus)._M_p[uVar11 * 2 + 1]);
        if (iVar5 == 0) goto LAB_0012ab60;
        *(byte *)((long)buf._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar11) =
             high << 4 | local_ba;
        uVar7 = pbVar13->_M_string_length;
      }
      std::__cxx11::string::assign
                ((char *)&ret,
                 (ulong)buf._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
LAB_0012ab60:
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buf);
      if (uVar11 < uVar7 >> 1) goto LAB_0012ab98;
      bVar2 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&der_names,(value_type *)&ret);
    }
    else {
LAB_0012ab98:
      bVar2 = false;
      fprintf(_stderr,"Bad hex string: %s.\n",(pbVar13->_M_dataplus)._M_p);
      bVar3 = true;
    }
    std::__cxx11::string::~string((string *)&ret);
    pbVar13 = pbVar13 + 1;
  } while (bVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  if (!bVar3) {
    this = &der_names;
LAB_0012abe1:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
  }
  ret._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
       OPENSSL_sk_new_null();
  pbVar13 = der_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((tuple<stack_st_X509_NAME_*,_bssl::internal::Deleter>)
      ret._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_NAME_*,_false>)0x0) {
    *(undefined8 *)local_90._M_head_impl = 0;
    _Var8._M_head_impl = local_90._M_head_impl;
  }
  else {
    for (pbVar9 = der_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar13; pbVar9 = pbVar9 + 1)
    {
      pbVar1 = (pointer)(pbVar9->_M_dataplus)._M_p;
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar1;
      _Var6._M_head_impl =
           (uchar *)d2i_X509_NAME((X509_NAME **)0x0,(uchar **)&parts,pbVar9->_M_string_length);
      if (((tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)_Var6._M_head_impl ==
           (_Head_base<0UL,_unsigned_char_*,_false>)0x0) ||
         (parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)((long)&(pbVar1->_M_dataplus)._M_p + pbVar9->_M_string_length))) {
        buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             _Var6._M_head_impl;
        fwrite("Failed to parse X509_NAME.\n",0x1b,1,_stderr);
LAB_0012acbc:
        _Var8._M_head_impl = local_90._M_head_impl;
        *(undefined8 *)local_90._M_head_impl = 0;
        std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&buf);
        goto LAB_0012accf;
      }
      buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
      local_40._M_t.super___uniq_ptr_impl<X509_name_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_X509_name_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_X509_name_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<X509_name_st,_bssl::internal::Deleter,_true,_true>)_Var6._M_head_impl;
      eVar4 = bssl::PushToStack<stack_st_X509_NAME>
                        ((stack_st_X509_NAME *)
                         ret._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>
                         ._M_t.super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>
                         .super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl,&local_40)
      ;
      std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
      if (!eVar4) goto LAB_0012acbc;
      std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&buf);
    }
    *(__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true> *)
     local_90._M_head_impl =
         ret._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl;
    ret._M_t.super___uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_X509_NAME_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_NAME_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_impl<stack_st_X509_NAME,_bssl::internal::Deleter>)0x0;
    _Var8._M_head_impl = local_90._M_head_impl;
  }
LAB_0012accf:
  std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr(&ret);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&der_names);
  return (__uniq_ptr_data<stack_st_X509_NAME,_bssl::internal::Deleter,_true,_true>)
         (tuple<stack_st_X509_NAME_*,_bssl::internal::Deleter>)_Var8._M_head_impl;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509_NAME)> DecodeHexX509Names(
    const std::string &hex_names) {
  const std::vector<std::string> der_names = DecodeHexStrings(hex_names);
  bssl::UniquePtr<STACK_OF(X509_NAME)> ret(sk_X509_NAME_new_null());
  if (!ret) {
    return nullptr;
  }

  for (const auto &der_name : der_names) {
    const uint8_t *const data =
        reinterpret_cast<const uint8_t *>(der_name.data());
    const uint8_t *derp = data;
    bssl::UniquePtr<X509_NAME> name(
        d2i_X509_NAME(nullptr, &derp, der_name.size()));
    if (!name || derp != data + der_name.size()) {
      fprintf(stderr, "Failed to parse X509_NAME.\n");
      return nullptr;
    }

    if (!bssl::PushToStack(ret.get(), std::move(name))) {
      return nullptr;
    }
  }

  return ret;
}